

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Own<kj::AppendableFile,_std::nullptr_t> __thiscall
kj::Directory::appendFile(Directory *this,PathPtr path,WriteMode mode)

{
  Clock *clock;
  _func_int **pp_Var1;
  undefined4 in_register_0000000c;
  AppendableFile *extraout_RDX;
  AppendableFile *extraout_RDX_00;
  AppendableFile *extraout_RDX_01;
  AppendableFile *extraout_RDX_02;
  AppendableFile *extraout_RDX_03;
  AppendableFile *extraout_RDX_04;
  AppendableFile *pAVar2;
  uint in_R8D;
  Own<kj::AppendableFile,_std::nullptr_t> OVar3;
  Fault f;
  _func_int **local_40;
  PathPtr path_local;
  
  path_local.parts.size_ = CONCAT44(in_register_0000000c,mode);
  path_local.parts.ptr = (String *)path.parts.size_;
  (**(code **)(((path.parts.ptr)->content).ptr + 0x80))(&f);
  if (local_40 == (_func_int **)0x0) {
    if ((in_R8D & 3) == 1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x256,FAILED,(char *)0x0,"\"file already exists\", path",
                 (char (*) [20])"file already exists",&path_local);
      kj::_::Debug::Fault::~Fault(&f);
      pAVar2 = extraout_RDX_00;
    }
    else if ((in_R8D & 3) == 2) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,600,FAILED,(char *)0x0,"\"file does not exist\", path",
                 (char (*) [20])"file does not exist",&path_local);
      kj::_::Debug::Fault::~Fault(&f);
      pAVar2 = extraout_RDX_01;
    }
    else if ((in_R8D & 3) == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[58],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x25a,FAILED,(char *)0x0,
                 "\"neither WriteMode::CREATE nor WriteMode::MODIFY was given\", path",
                 (char (*) [58])"neither WriteMode::CREATE nor WriteMode::MODIFY was given",
                 &path_local);
      kj::_::Debug::Fault::~Fault(&f);
      pAVar2 = extraout_RDX_03;
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x25d,FAILED,(char *)0x0,
                 "\"tryAppendFile() returned null despite no preconditions\", path",
                 (char (*) [55])"tryAppendFile() returned null despite no preconditions",&path_local
                );
      kj::_::Debug::Fault::~Fault(&f);
      pAVar2 = extraout_RDX_02;
    }
  }
  else {
    (this->super_ReadableDirectory).super_FsNode._vptr_FsNode = (_func_int **)f.exception;
    this[1].super_ReadableDirectory.super_FsNode._vptr_FsNode = local_40;
    pAVar2 = extraout_RDX;
  }
  if (local_40 == (_func_int **)0x0) {
    clock = nullClock();
    newInMemoryFile((kj *)&f,clock);
    pp_Var1 = (_func_int **)operator_new(0x20);
    *pp_Var1 = (_func_int *)&PTR_getFd_0028fbb8;
    pp_Var1[1] = (_func_int *)&PTR__AppendableFileImpl_0028fc10;
    pp_Var1[2] = (_func_int *)f.exception;
    pp_Var1[3] = (_func_int *)0x0;
    (this->super_ReadableDirectory).super_FsNode._vptr_FsNode =
         (_func_int **)&kj::_::HeapDisposer<kj::(anonymous_namespace)::AppendableFileImpl>::instance
    ;
    this[1].super_ReadableDirectory.super_FsNode._vptr_FsNode = pp_Var1;
    pAVar2 = extraout_RDX_04;
  }
  OVar3.ptr = pAVar2;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<AppendableFile> Directory::appendFile(PathPtr path, WriteMode mode) const {
  KJ_IF_SOME(f, tryAppendFile(path, mode)) {
    return kj::mv(f);
  } else if (has(mode, WriteMode::CREATE) && !has(mode, WriteMode::MODIFY)) {
    KJ_FAIL_REQUIRE("file already exists", path) { break; }
  } else if (has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_REQUIRE("file does not exist", path) { break; }
  } else if (!has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_ASSERT("neither WriteMode::CREATE nor WriteMode::MODIFY was given", path) { break; }
  } else {
    // Shouldn't happen.
    KJ_FAIL_ASSERT("tryAppendFile() returned null despite no preconditions", path) { break; }